

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * efsw::String::fromUtf8(String *__return_storage_ptr__,string *utf8String)

{
  long lVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  back_insert_iterator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  output;
  undefined1 local_38 [8];
  StringType utf32;
  string *utf8String_local;
  
  utf32.field_2._8_8_ = utf8String;
  std::__cxx11::u32string::u32string((u32string *)local_38);
  lVar1 = std::__cxx11::string::length();
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  reserve((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)local_38,
          lVar1 + 1);
  begin._M_current = (char *)std::__cxx11::string::begin();
  end._M_current = (char *)std::__cxx11::string::end();
  output = std::back_inserter<std::__cxx11::u32string>
                     ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                       *)local_38);
  Utf<8u>::
  ToUtf32<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::u32string>>
            (begin,end,output);
  String(__return_storage_ptr__,(StringType *)local_38);
  std::__cxx11::u32string::~u32string((u32string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

String String::fromUtf8( const std::string& utf8String ) {
	String::StringType utf32;

	utf32.reserve( utf8String.length() + 1 );

	Utf8::ToUtf32( utf8String.begin(), utf8String.end(), std::back_inserter( utf32 ) );

	return String( utf32 );
}